

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledOutputFile.cpp
# Opt level: O2

void __thiscall Imf_2_5::DeepTiledOutputFile::initialize(DeepTiledOutputFile *this,Header *header)

{
  int maxX;
  int minY;
  int maxY;
  uint uVar1;
  LevelMode LVar2;
  LevelRoundingMode LVar3;
  int iVar4;
  Format FVar5;
  LineOrder *pLVar6;
  TileDescription *pTVar7;
  Box2i *pBVar8;
  Compression *pCVar9;
  Compressor *pCVar10;
  TileBuffer *pTVar11;
  Data *pDVar12;
  pointer ppTVar13;
  ulong uVar14;
  TileOffsets TStack_48;
  
  Header::operator=(&this->_data->header,header);
  Header::setType(&this->_data->header,(string *)DEEPTILE_abi_cxx11_);
  pLVar6 = Header::lineOrder(&this->_data->header);
  pDVar12 = this->_data;
  pDVar12->lineOrder = *pLVar6;
  pTVar7 = Header::tileDescription(&pDVar12->header);
  pDVar12 = this->_data;
  uVar1 = pTVar7->ySize;
  LVar2 = pTVar7->mode;
  LVar3 = pTVar7->roundingMode;
  (pDVar12->tileDesc).xSize = pTVar7->xSize;
  (pDVar12->tileDesc).ySize = uVar1;
  (pDVar12->tileDesc).mode = LVar2;
  (pDVar12->tileDesc).roundingMode = LVar3;
  pBVar8 = Header::dataWindow(&this->_data->header);
  iVar4 = (pBVar8->min).x;
  pDVar12 = this->_data;
  pDVar12->minX = iVar4;
  maxX = (pBVar8->max).x;
  pDVar12->maxX = maxX;
  minY = (pBVar8->min).y;
  pDVar12->minY = minY;
  maxY = (pBVar8->max).y;
  pDVar12->maxY = maxY;
  precalculateTileInfo
            (&pDVar12->tileDesc,iVar4,maxX,minY,maxY,&pDVar12->numXTiles,&pDVar12->numYTiles,
             &pDVar12->numXLevels,&pDVar12->numYLevels);
  pDVar12 = this->_data;
  if (pDVar12->lineOrder == INCREASING_Y) {
    iVar4 = 0;
  }
  else {
    iVar4 = *pDVar12->numYTiles + -1;
  }
  (pDVar12->nextTileToWrite).dx = 0;
  (pDVar12->nextTileToWrite).dy = iVar4;
  (pDVar12->nextTileToWrite).lx = 0;
  (pDVar12->nextTileToWrite).ly = 0;
  pCVar9 = Header::compression(&pDVar12->header);
  pCVar10 = newTileCompressor(*pCVar9,0,(ulong)(this->_data->tileDesc).ySize,&this->_data->header);
  FVar5 = defaultFormat(pCVar10);
  pDVar12 = this->_data;
  pDVar12->format = FVar5;
  if (pCVar10 != (Compressor *)0x0) {
    (*pCVar10->_vptr_Compressor[1])(pCVar10);
    pDVar12 = this->_data;
  }
  TileOffsets::TileOffsets
            (&TStack_48,(pDVar12->tileDesc).mode,pDVar12->numXLevels,pDVar12->numYLevels,
             pDVar12->numXTiles,pDVar12->numYTiles);
  TileOffsets::operator=(&this->_data->tileOffsets,&TStack_48);
  std::
  vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ::~vector(&TStack_48._offsets);
  pDVar12 = this->_data;
  iVar4 = getChunkOffsetTableSize(&pDVar12->header,false);
  Header::setChunkCount(&pDVar12->header,iVar4);
  pDVar12 = this->_data;
  pDVar12->maxSampleCountTableSize =
       (ulong)((pDVar12->tileDesc).xSize * (pDVar12->tileDesc).ySize) << 2;
  ppTVar13 = (pDVar12->tileBuffers).
             super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  for (uVar14 = 0;
      uVar14 < (ulong)((long)(pDVar12->tileBuffers).
                             super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar13 >> 3);
      uVar14 = uVar14 + 1) {
    pTVar11 = (TileBuffer *)operator_new(0xb8);
    pTVar11->uncompressedData = (char *)0x0;
    pTVar11->buffer = (char *)0x0;
    *(undefined8 *)&pTVar11->dataSize = 0;
    pTVar11->compressor = (Compressor *)0x0;
    pTVar11->dy = 0;
    pTVar11->lx = 0;
    pTVar11->ly = 0;
    pTVar11->hasException = false;
    *(undefined3 *)&pTVar11->field_0x35 = 0;
    (pTVar11->exception)._M_dataplus._M_p = (pointer)0x0;
    (pTVar11->exception)._M_string_length = 0;
    *(undefined8 *)((long)&(pTVar11->exception).field_2 + 8) = 0;
    *(undefined8 *)&pTVar11->_sem = 0;
    *(undefined8 *)&pTVar11->field_0x59 = 0;
    *(undefined8 *)&pTVar11->field_0x61 = 0;
    *(TileBuffer **)&pTVar11->field_0x70 = pTVar11 + 1;
    *(undefined8 *)&pTVar11->field_0x78 = 0;
    *(undefined1 *)&pTVar11[1].uncompressedData = 0;
    IlmThread_2_5::Semaphore::Semaphore((Semaphore *)&pTVar11[1].dataSize,1);
    (this->_data->tileBuffers).
    super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
    ._M_impl.super__Vector_impl_data._M_start[uVar14] = pTVar11;
    Array<char>::resizeErase
              ((Array<char> *)
               &(this->_data->tileBuffers).
                super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar14]->ly,
               this->_data->maxSampleCountTableSize);
    memset(((this->_data->tileBuffers).
            super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar14]->exception)._M_dataplus._M_p,0,
           this->_data->maxSampleCountTableSize);
    pCVar9 = Header::compression(&this->_data->header);
    pCVar10 = newCompressor(*pCVar9,this->_data->maxSampleCountTableSize,&this->_data->header);
    pDVar12 = this->_data;
    ppTVar13 = (pDVar12->tileBuffers).
               super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    *(Compressor **)((long)&(ppTVar13[uVar14]->exception).field_2 + 8) = pCVar10;
  }
  return;
}

Assistant:

void
DeepTiledOutputFile::initialize (const Header &header)
{
    _data->header = header;
    _data->header.setType(DEEPTILE);
    _data->lineOrder = _data->header.lineOrder();

    //
    // Check that the file is indeed tiled
    //

    _data->tileDesc = _data->header.tileDescription();

    //
    // Save the dataWindow information
    //

    const Box2i &dataWindow = _data->header.dataWindow();
    _data->minX = dataWindow.min.x;
    _data->maxX = dataWindow.max.x;
    _data->minY = dataWindow.min.y;
    _data->maxY = dataWindow.max.y;

    //
    // Precompute level and tile information to speed up utility functions
    //

    precalculateTileInfo (_data->tileDesc,
                          _data->minX, _data->maxX,
                          _data->minY, _data->maxY,
                          _data->numXTiles, _data->numYTiles,
                          _data->numXLevels, _data->numYLevels);

    //
    // Determine the first tile coordinate that we will be writing
    // if the file is not RANDOM_Y.
    //

    _data->nextTileToWrite = (_data->lineOrder == INCREASING_Y)?
                               TileCoord (0, 0, 0, 0):
                               TileCoord (0, _data->numYTiles[0] - 1, 0, 0);

    Compressor* compressor = newTileCompressor
                                (_data->header.compression(),
                                 0,
                                 _data->tileDesc.ySize,
                                 _data->header);

    _data->format = defaultFormat (compressor);

    if (compressor != 0)
        delete compressor;

    _data->tileOffsets = TileOffsets (_data->tileDesc.mode,
                                      _data->numXLevels,
                                      _data->numYLevels,
                                      _data->numXTiles,
                                      _data->numYTiles);
                                      
    //ignore the existing value of chunkCount - correct it if it's wrong
    _data->header.setChunkCount(getChunkOffsetTableSize(_data->header));
                                      
    _data->maxSampleCountTableSize = _data->tileDesc.ySize *
                                     _data->tileDesc.xSize *
                                     sizeof(int);

                                     
    for (size_t i = 0; i < _data->tileBuffers.size(); i++)
    {
        _data->tileBuffers[i] = new TileBuffer ();

        _data->tileBuffers[i]->sampleCountTableBuffer.
                resizeErase(_data->maxSampleCountTableSize);

        char * p = &(_data->tileBuffers[i]->sampleCountTableBuffer[0]);
        memset (p, 0, _data->maxSampleCountTableSize);

        _data->tileBuffers[i]->sampleCountTableCompressor =
                newCompressor (_data->header.compression(),
                               _data->maxSampleCountTableSize,
                               _data->header);
    }
}